

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor_extras.c
# Opt level: O0

int canvas_do_triggerize(_glist *cnv,t_triggerize_return *tr)

{
  int iVar1;
  undefined1 local_19;
  t_triggerize_return *tr_local;
  _glist *cnv_local;
  
  iVar1 = triggerize_line(cnv,tr);
  local_19 = true;
  if (iVar1 == 0) {
    iVar1 = triggerize_fanouts(cnv);
    local_19 = true;
    if (iVar1 == 0) {
      iVar1 = triggerize_triggers(cnv);
      local_19 = iVar1 != 0;
    }
  }
  return (int)local_19;
}

Assistant:

static int canvas_do_triggerize(t_glist*cnv, t_triggerize_return*tr)
{
        /*
         * selected msg-connection: insert [t a] (->triggerize_line)
         * selected sig-connection: insert [pd nop~] (->triggerize_line)
         * selected [trigger]s with fan-outs: remove them (by inserting new outlets of the correct type) (->triggerize_fanouts)
         * selected objects with fan-outs: remove fan-outs (->triggerize_fanouts)
         * selected [trigger]: remove unused outlets (->triggerize_triggers)
         * selected [trigger]: else, add left-most "a" outlet (->triggerize_triggers)
         */

    return(triggerize_line(cnv, tr)
        || triggerize_fanouts(cnv)
        || triggerize_triggers(cnv));
}